

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  ulong uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCRayQueryContext *pRVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined4 uVar87;
  undefined1 auVar88 [32];
  undefined4 uVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  int iVar103;
  uint uVar104;
  long lVar105;
  undefined4 uVar106;
  ulong unaff_RBX;
  ulong uVar107;
  undefined1 (*pauVar108) [16];
  long lVar109;
  undefined1 (*pauVar110) [16];
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  undefined1 (*pauVar114) [16];
  undefined1 (*pauVar115) [16];
  ulong uVar116;
  long lVar117;
  ulong uVar118;
  ulong uVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  undefined1 auVar125 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar127 [32];
  undefined1 auVar126 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar148;
  float fVar149;
  undefined1 auVar147 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [64];
  uint uVar168;
  undefined1 auVar169 [32];
  uint uVar171;
  uint uVar172;
  uint uVar173;
  uint uVar174;
  uint uVar175;
  uint uVar176;
  undefined1 auVar170 [64];
  undefined1 auVar177 [32];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  float fVar180;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27d4;
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  ulong local_2780;
  ulong local_2778;
  float local_2770;
  float local_276c;
  float local_2768;
  float local_2764;
  float local_2760;
  undefined4 local_275c;
  uint local_2758;
  uint local_2754;
  uint local_2750;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  float fStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined4 uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      pauVar114 = (undefined1 (*) [16])local_2390;
      auVar125 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar138 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar2 = (ray->super_RayK<1>).dir.field_0;
      auVar145._8_4_ = 0x7fffffff;
      auVar145._0_8_ = 0x7fffffff7fffffff;
      auVar145._12_4_ = 0x7fffffff;
      auVar145 = vandps_avx((undefined1  [16])aVar2,auVar145);
      auVar150._8_4_ = 0x219392ef;
      auVar150._0_8_ = 0x219392ef219392ef;
      auVar150._12_4_ = 0x219392ef;
      auVar145 = vcmpps_avx(auVar145,auVar150,1);
      auVar145 = vblendvps_avx((undefined1  [16])aVar2,auVar150,auVar145);
      auVar150 = vrcpps_avx(auVar145);
      fVar124 = auVar150._0_4_;
      auVar141._0_4_ = auVar145._0_4_ * fVar124;
      fVar133 = auVar150._4_4_;
      auVar141._4_4_ = auVar145._4_4_ * fVar133;
      fVar134 = auVar150._8_4_;
      auVar141._8_4_ = auVar145._8_4_ * fVar134;
      fVar135 = auVar150._12_4_;
      auVar141._12_4_ = auVar145._12_4_ * fVar135;
      auVar151._8_4_ = 0x3f800000;
      auVar151._0_8_ = &DAT_3f8000003f800000;
      auVar151._12_4_ = 0x3f800000;
      auVar145 = vsubps_avx(auVar151,auVar141);
      uVar106 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23e0._4_4_ = uVar106;
      local_23e0._0_4_ = uVar106;
      local_23e0._8_4_ = uVar106;
      local_23e0._12_4_ = uVar106;
      local_23e0._16_4_ = uVar106;
      local_23e0._20_4_ = uVar106;
      local_23e0._24_4_ = uVar106;
      local_23e0._28_4_ = uVar106;
      auVar156 = ZEXT3264(local_23e0);
      uVar106 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2400._4_4_ = uVar106;
      local_2400._0_4_ = uVar106;
      local_2400._8_4_ = uVar106;
      local_2400._12_4_ = uVar106;
      local_2400._16_4_ = uVar106;
      local_2400._20_4_ = uVar106;
      local_2400._24_4_ = uVar106;
      local_2400._28_4_ = uVar106;
      auVar158 = ZEXT3264(local_2400);
      auVar142._0_4_ = fVar124 + fVar124 * auVar145._0_4_;
      auVar142._4_4_ = fVar133 + fVar133 * auVar145._4_4_;
      auVar142._8_4_ = fVar134 + fVar134 * auVar145._8_4_;
      auVar142._12_4_ = fVar135 + fVar135 * auVar145._12_4_;
      uVar106 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2420._4_4_ = uVar106;
      local_2420._0_4_ = uVar106;
      local_2420._8_4_ = uVar106;
      local_2420._12_4_ = uVar106;
      local_2420._16_4_ = uVar106;
      local_2420._20_4_ = uVar106;
      local_2420._24_4_ = uVar106;
      local_2420._28_4_ = uVar106;
      auVar161 = ZEXT3264(local_2420);
      auVar145 = vshufps_avx(auVar142,auVar142,0);
      local_2440._16_16_ = auVar145;
      local_2440._0_16_ = auVar145;
      auVar170 = ZEXT3264(local_2440);
      auVar145 = vmovshdup_avx(auVar142);
      auVar150 = vshufps_avx(auVar142,auVar142,0x55);
      local_2460._16_16_ = auVar150;
      local_2460._0_16_ = auVar150;
      auVar178 = ZEXT3264(local_2460);
      auVar150 = vshufpd_avx(auVar142,auVar142,1);
      auVar141 = vshufps_avx(auVar142,auVar142,0xaa);
      uVar113 = (ulong)(auVar142._0_4_ < 0.0) * 0x20;
      uVar116 = (ulong)(auVar145._0_4_ < 0.0) << 5 | 0x40;
      local_2480._16_16_ = auVar141;
      local_2480._0_16_ = auVar141;
      auVar179 = ZEXT3264(local_2480);
      uVar107 = (ulong)(auVar150._0_4_ < 0.0) << 5 | 0x80;
      local_2778 = uVar107 ^ 0x20;
      auVar145 = vshufps_avx(auVar125,auVar125,0);
      local_24a0._16_16_ = auVar145;
      local_24a0._0_16_ = auVar145;
      auVar182 = ZEXT3264(local_24a0);
      auVar145 = vshufps_avx(auVar138,auVar138,0);
      local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
      local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
      auVar123 = ZEXT3264(CONCAT1616(auVar145,auVar145));
      local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
      auVar127._8_4_ = 0xbf800000;
      auVar127._0_8_ = 0xbf800000bf800000;
      auVar127._12_4_ = 0xbf800000;
      auVar127._16_4_ = 0xbf800000;
      auVar127._20_4_ = 0xbf800000;
      auVar127._24_4_ = 0xbf800000;
      auVar127._28_4_ = 0xbf800000;
      auVar144._8_4_ = 0x3f800000;
      auVar144._0_8_ = &DAT_3f8000003f800000;
      auVar144._12_4_ = 0x3f800000;
      auVar144._16_4_ = 0x3f800000;
      auVar144._20_4_ = 0x3f800000;
      auVar144._24_4_ = 0x3f800000;
      auVar144._28_4_ = 0x3f800000;
      _local_24e0 = vblendvps_avx(auVar144,auVar127,local_24c0);
      local_2780 = uVar116;
      uVar112 = uVar116;
      do {
        do {
          do {
            if (pauVar114 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar115 = pauVar114 + -1;
            pauVar114 = pauVar114 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar115 + 8));
          uVar119 = *(ulong *)*pauVar114;
          do {
            auVar128 = auVar161._0_32_;
            auVar144 = auVar158._0_32_;
            auVar127 = auVar156._0_32_;
            if ((uVar119 & 8) == 0) {
              auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + uVar113),auVar127);
              auVar76._4_4_ = auVar170._4_4_ * auVar120._4_4_;
              auVar76._0_4_ = auVar170._0_4_ * auVar120._0_4_;
              auVar76._8_4_ = auVar170._8_4_ * auVar120._8_4_;
              auVar76._12_4_ = auVar170._12_4_ * auVar120._12_4_;
              auVar76._16_4_ = auVar170._16_4_ * auVar120._16_4_;
              auVar76._20_4_ = auVar170._20_4_ * auVar120._20_4_;
              auVar76._24_4_ = auVar170._24_4_ * auVar120._24_4_;
              auVar76._28_4_ = auVar120._28_4_;
              auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + uVar112),auVar144);
              auVar77._4_4_ = auVar178._4_4_ * auVar120._4_4_;
              auVar77._0_4_ = auVar178._0_4_ * auVar120._0_4_;
              auVar77._8_4_ = auVar178._8_4_ * auVar120._8_4_;
              auVar77._12_4_ = auVar178._12_4_ * auVar120._12_4_;
              auVar77._16_4_ = auVar178._16_4_ * auVar120._16_4_;
              auVar77._20_4_ = auVar178._20_4_ * auVar120._20_4_;
              auVar77._24_4_ = auVar178._24_4_ * auVar120._24_4_;
              auVar77._28_4_ = auVar120._28_4_;
              auVar120 = vmaxps_avx(auVar76,auVar77);
              auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + uVar107),auVar128);
              auVar78._4_4_ = auVar179._4_4_ * auVar76._4_4_;
              auVar78._0_4_ = auVar179._0_4_ * auVar76._0_4_;
              auVar78._8_4_ = auVar179._8_4_ * auVar76._8_4_;
              auVar78._12_4_ = auVar179._12_4_ * auVar76._12_4_;
              auVar78._16_4_ = auVar179._16_4_ * auVar76._16_4_;
              auVar78._20_4_ = auVar179._20_4_ * auVar76._20_4_;
              auVar78._24_4_ = auVar179._24_4_ * auVar76._24_4_;
              auVar78._28_4_ = auVar76._28_4_;
              auVar76 = vmaxps_avx(auVar78,auVar182._0_32_);
              local_2660 = vmaxps_avx(auVar120,auVar76);
              auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + (uVar113 ^ 0x20)),
                                    auVar127);
              auVar83._4_4_ = auVar170._4_4_ * auVar120._4_4_;
              auVar83._0_4_ = auVar170._0_4_ * auVar120._0_4_;
              auVar83._8_4_ = auVar170._8_4_ * auVar120._8_4_;
              auVar83._12_4_ = auVar170._12_4_ * auVar120._12_4_;
              auVar83._16_4_ = auVar170._16_4_ * auVar120._16_4_;
              auVar83._20_4_ = auVar170._20_4_ * auVar120._20_4_;
              auVar83._24_4_ = auVar170._24_4_ * auVar120._24_4_;
              auVar83._28_4_ = auVar120._28_4_;
              auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + (uVar116 ^ 0x20)),
                                    auVar144);
              auVar84._4_4_ = auVar178._4_4_ * auVar120._4_4_;
              auVar84._0_4_ = auVar178._0_4_ * auVar120._0_4_;
              auVar84._8_4_ = auVar178._8_4_ * auVar120._8_4_;
              auVar84._12_4_ = auVar178._12_4_ * auVar120._12_4_;
              auVar84._16_4_ = auVar178._16_4_ * auVar120._16_4_;
              auVar84._20_4_ = auVar178._20_4_ * auVar120._20_4_;
              auVar84._24_4_ = auVar178._24_4_ * auVar120._24_4_;
              auVar84._28_4_ = auVar120._28_4_;
              auVar120 = vminps_avx(auVar83,auVar84);
              auVar76 = vsubps_avx(*(undefined1 (*) [32])(uVar119 + 0x40 + local_2778),auVar128);
              auVar85._4_4_ = auVar179._4_4_ * auVar76._4_4_;
              auVar85._0_4_ = auVar179._0_4_ * auVar76._0_4_;
              auVar85._8_4_ = auVar179._8_4_ * auVar76._8_4_;
              auVar85._12_4_ = auVar179._12_4_ * auVar76._12_4_;
              auVar85._16_4_ = auVar179._16_4_ * auVar76._16_4_;
              auVar85._20_4_ = auVar179._20_4_ * auVar76._20_4_;
              auVar85._24_4_ = auVar179._24_4_ * auVar76._24_4_;
              auVar85._28_4_ = auVar76._28_4_;
              auVar76 = vminps_avx(auVar85,auVar123._0_32_);
              auVar120 = vminps_avx(auVar120,auVar76);
              auVar120 = vcmpps_avx(local_2660,auVar120,2);
              uVar106 = vmovmskps_avx(auVar120);
              unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar106);
            }
            if ((uVar119 & 8) == 0) {
              if (unaff_RBX == 0) {
                iVar103 = 4;
              }
              else {
                uVar118 = uVar119 & 0xfffffffffffffff0;
                lVar117 = 0;
                if (unaff_RBX != 0) {
                  for (; (unaff_RBX >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                  }
                }
                iVar103 = 0;
                uVar119 = *(ulong *)(uVar118 + lVar117 * 8);
                uVar111 = unaff_RBX - 1 & unaff_RBX;
                if (uVar111 != 0) {
                  uVar168 = *(uint *)(local_2660 + lVar117 * 4);
                  lVar117 = 0;
                  if (uVar111 != 0) {
                    for (; (uVar111 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                    }
                  }
                  uVar3 = *(ulong *)(uVar118 + lVar117 * 8);
                  uVar104 = *(uint *)(local_2660 + lVar117 * 4);
                  uVar111 = uVar111 - 1 & uVar111;
                  if (uVar111 == 0) {
                    if (uVar168 < uVar104) {
                      *(ulong *)*pauVar114 = uVar3;
                      *(uint *)(*pauVar114 + 8) = uVar104;
                      pauVar114 = pauVar114 + 1;
                    }
                    else {
                      *(ulong *)*pauVar114 = uVar119;
                      *(uint *)(*pauVar114 + 8) = uVar168;
                      pauVar114 = pauVar114 + 1;
                      uVar119 = uVar3;
                    }
                  }
                  else {
                    auVar125._8_8_ = 0;
                    auVar125._0_8_ = uVar119;
                    auVar145 = vpunpcklqdq_avx(auVar125,ZEXT416(uVar168));
                    auVar138._8_8_ = 0;
                    auVar138._0_8_ = uVar3;
                    auVar125 = vpunpcklqdq_avx(auVar138,ZEXT416(uVar104));
                    lVar117 = 0;
                    if (uVar111 != 0) {
                      for (; (uVar111 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                      }
                    }
                    auVar143._8_8_ = 0;
                    auVar143._0_8_ = *(ulong *)(uVar118 + lVar117 * 8);
                    auVar138 = vpunpcklqdq_avx(auVar143,ZEXT416(*(uint *)(local_2660 + lVar117 * 4))
                                              );
                    uVar111 = uVar111 - 1 & uVar111;
                    if (uVar111 == 0) {
                      auVar150 = vpcmpgtd_avx(auVar125,auVar145);
                      auVar141 = vpshufd_avx(auVar150,0xaa);
                      auVar150 = vblendvps_avx(auVar125,auVar145,auVar141);
                      auVar145 = vblendvps_avx(auVar145,auVar125,auVar141);
                      auVar125 = vpcmpgtd_avx(auVar138,auVar150);
                      auVar141 = vpshufd_avx(auVar125,0xaa);
                      auVar125 = vblendvps_avx(auVar138,auVar150,auVar141);
                      auVar138 = vblendvps_avx(auVar150,auVar138,auVar141);
                      auVar150 = vpcmpgtd_avx(auVar138,auVar145);
                      auVar141 = vpshufd_avx(auVar150,0xaa);
                      auVar150 = vblendvps_avx(auVar138,auVar145,auVar141);
                      auVar145 = vblendvps_avx(auVar145,auVar138,auVar141);
                      *pauVar114 = auVar145;
                      pauVar114[1] = auVar150;
                      uVar119 = auVar125._0_8_;
                      pauVar114 = pauVar114 + 2;
                    }
                    else {
                      lVar117 = 0;
                      if (uVar111 != 0) {
                        for (; (uVar111 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                        }
                      }
                      auVar146._8_8_ = 0;
                      auVar146._0_8_ = *(ulong *)(uVar118 + lVar117 * 8);
                      auVar150 = vpunpcklqdq_avx(auVar146,ZEXT416(*(uint *)(local_2660 + lVar117 * 4
                                                                           )));
                      uVar111 = uVar111 - 1 & uVar111;
                      if (uVar111 == 0) {
                        auVar141 = vpcmpgtd_avx(auVar125,auVar145);
                        auVar142 = vpshufd_avx(auVar141,0xaa);
                        auVar141 = vblendvps_avx(auVar125,auVar145,auVar142);
                        auVar145 = vblendvps_avx(auVar145,auVar125,auVar142);
                        auVar125 = vpcmpgtd_avx(auVar150,auVar138);
                        auVar142 = vpshufd_avx(auVar125,0xaa);
                        auVar125 = vblendvps_avx(auVar150,auVar138,auVar142);
                        auVar138 = vblendvps_avx(auVar138,auVar150,auVar142);
                        auVar150 = vpcmpgtd_avx(auVar138,auVar145);
                        auVar142 = vpshufd_avx(auVar150,0xaa);
                        auVar150 = vblendvps_avx(auVar138,auVar145,auVar142);
                        auVar145 = vblendvps_avx(auVar145,auVar138,auVar142);
                        auVar138 = vpcmpgtd_avx(auVar125,auVar141);
                        auVar142 = vpshufd_avx(auVar138,0xaa);
                        auVar138 = vblendvps_avx(auVar125,auVar141,auVar142);
                        auVar125 = vblendvps_avx(auVar141,auVar125,auVar142);
                        auVar141 = vpcmpgtd_avx(auVar150,auVar125);
                        auVar142 = vpshufd_avx(auVar141,0xaa);
                        auVar141 = vblendvps_avx(auVar150,auVar125,auVar142);
                        auVar125 = vblendvps_avx(auVar125,auVar150,auVar142);
                        *pauVar114 = auVar145;
                        pauVar114[1] = auVar125;
                        pauVar114[2] = auVar141;
                        uVar119 = auVar138._0_8_;
                        pauVar115 = pauVar114 + 3;
                      }
                      else {
                        *pauVar114 = auVar145;
                        pauVar114[1] = auVar125;
                        pauVar114[2] = auVar138;
                        pauVar114[3] = auVar150;
                        lVar117 = 0x30;
                        do {
                          lVar109 = lVar117;
                          lVar117 = 0;
                          if (uVar111 != 0) {
                            for (; (uVar111 >> lVar117 & 1) == 0; lVar117 = lVar117 + 1) {
                            }
                          }
                          auVar126._8_8_ = 0;
                          auVar126._0_8_ = *(ulong *)(uVar118 + lVar117 * 8);
                          auVar145 = vpunpcklqdq_avx(auVar126,ZEXT416(*(uint *)(local_2660 +
                                                                               lVar117 * 4)));
                          *(undefined1 (*) [16])(pauVar114[1] + lVar109) = auVar145;
                          uVar111 = uVar111 & uVar111 - 1;
                          lVar117 = lVar109 + 0x10;
                        } while (uVar111 != 0);
                        pauVar115 = (undefined1 (*) [16])(pauVar114[1] + lVar109);
                        if (lVar109 + 0x10 != 0) {
                          lVar117 = 0x10;
                          pauVar108 = pauVar114;
                          do {
                            auVar145 = pauVar108[1];
                            uVar168 = *(uint *)(pauVar108[1] + 8);
                            pauVar108 = pauVar108 + 1;
                            lVar109 = lVar117;
                            do {
                              if (uVar168 <= *(uint *)(pauVar114[-1] + lVar109 + 8)) {
                                pauVar110 = (undefined1 (*) [16])(*pauVar114 + lVar109);
                                break;
                              }
                              *(undefined1 (*) [16])(*pauVar114 + lVar109) =
                                   *(undefined1 (*) [16])(pauVar114[-1] + lVar109);
                              lVar109 = lVar109 + -0x10;
                              pauVar110 = pauVar114;
                            } while (lVar109 != 0);
                            *pauVar110 = auVar145;
                            lVar117 = lVar117 + 0x10;
                          } while (pauVar115 != pauVar108);
                        }
                        uVar119 = *(ulong *)*pauVar115;
                      }
                      auVar156 = ZEXT3264(auVar127);
                      auVar158 = ZEXT3264(auVar144);
                      auVar161 = ZEXT3264(auVar128);
                      auVar170 = ZEXT3264(auVar170._0_32_);
                      auVar178 = ZEXT3264(auVar178._0_32_);
                      auVar179 = ZEXT3264(auVar179._0_32_);
                      auVar182 = ZEXT3264(auVar182._0_32_);
                      pauVar114 = pauVar115;
                      iVar103 = 0;
                    }
                  }
                }
              }
            }
            else {
              iVar103 = 6;
            }
          } while (iVar103 == 0);
        } while (iVar103 != 6);
        uVar112 = (ulong)((uint)uVar119 & 0xf);
        if (uVar112 != 8) {
          uVar119 = uVar119 & 0xfffffffffffffff0;
          lVar117 = 0;
          do {
            lVar105 = lVar117 * 0x60;
            pSVar4 = context->scene;
            ppfVar5 = (pSVar4->vertices).items;
            pfVar6 = ppfVar5[*(uint *)(uVar119 + 0x40 + lVar105)];
            pfVar7 = ppfVar5[*(uint *)(uVar119 + 0x44 + lVar105)];
            pfVar8 = ppfVar5[*(uint *)(uVar119 + 0x48 + lVar105)];
            pfVar9 = ppfVar5[*(uint *)(uVar119 + 0x4c + lVar105)];
            auVar138 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar119 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 8 + lVar105)));
            auVar145 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar119 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 8 + lVar105)));
            auVar150 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 4 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0xc + lVar105)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 4 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0xc + lVar105)));
            auVar142 = vunpcklps_avx(auVar145,auVar125);
            auVar151 = vunpcklps_avx(auVar138,auVar150);
            auVar145 = vunpckhps_avx(auVar138,auVar150);
            auVar150 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x10 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x18 + lVar105)));
            auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x10 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x18 + lVar105)));
            auVar141 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 0x14 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0x1c + lVar105)));
            auVar138 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 0x14 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0x1c + lVar105)));
            auVar143 = vunpcklps_avx(auVar125,auVar138);
            auVar146 = vunpcklps_avx(auVar150,auVar141);
            auVar125 = vunpckhps_avx(auVar150,auVar141);
            auVar141 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x20 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x28 + lVar105)));
            auVar138 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x20 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x28 + lVar105)));
            auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 0x24 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0x2c + lVar105)));
            auVar150 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 0x24 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0x2c + lVar105)));
            auVar79 = vunpcklps_avx(auVar138,auVar150);
            auVar80 = vunpcklps_avx(auVar141,auVar126);
            auVar138 = vunpckhps_avx(auVar141,auVar126);
            auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x30 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x38 + lVar105)));
            auVar150 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar6 + *(uint *)(uVar119 + 0x30 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar8 + *(uint *)(uVar119 + 0x38 + lVar105)));
            auVar81 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar119 + 0x34 + lVar105)),
                                    *(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar119 + 0x3c + lVar105)));
            auVar141 = vunpckhps_avx(*(undefined1 (*) [16])
                                      (pfVar7 + *(uint *)(uVar119 + 0x34 + lVar105)),
                                     *(undefined1 (*) [16])
                                      (pfVar9 + *(uint *)(uVar119 + 0x3c + lVar105)));
            auVar141 = vunpcklps_avx(auVar150,auVar141);
            auVar82 = vunpcklps_avx(auVar126,auVar81);
            auVar150 = vunpckhps_avx(auVar126,auVar81);
            lVar109 = uVar119 + 0x40 + lVar105;
            local_23c0 = *(undefined8 *)(lVar109 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar109 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar105 = uVar119 + 0x50 + lVar105;
            local_2680 = *(undefined8 *)(lVar105 + 0x10);
            uStack_2678 = *(undefined8 *)(lVar105 + 0x18);
            uStack_2670 = local_2680;
            uStack_2668 = uStack_2678;
            auVar147._16_16_ = auVar80;
            auVar147._0_16_ = auVar151;
            auVar152._16_16_ = auVar138;
            auVar152._0_16_ = auVar145;
            auVar157._16_16_ = auVar79;
            auVar157._0_16_ = auVar142;
            auVar128._16_16_ = auVar146;
            auVar128._0_16_ = auVar146;
            auVar154._16_16_ = auVar125;
            auVar154._0_16_ = auVar125;
            auVar139._16_16_ = auVar143;
            auVar139._0_16_ = auVar143;
            auVar169._16_16_ = auVar82;
            auVar169._0_16_ = auVar82;
            auVar177._16_16_ = auVar150;
            auVar177._0_16_ = auVar150;
            auVar120._16_16_ = auVar141;
            auVar120._0_16_ = auVar141;
            local_27a0 = vsubps_avx(auVar147,auVar128);
            local_2700 = vsubps_avx(auVar152,auVar154);
            auVar127 = vsubps_avx(auVar157,auVar139);
            auVar144 = vsubps_avx(auVar169,auVar147);
            auVar128 = vsubps_avx(auVar177,auVar152);
            auVar120 = vsubps_avx(auVar120,auVar157);
            fVar135 = auVar120._0_4_;
            fVar180 = local_2700._0_4_;
            fVar16 = auVar120._4_4_;
            fVar183 = local_2700._4_4_;
            auVar86._4_4_ = fVar183 * fVar16;
            auVar86._0_4_ = fVar180 * fVar135;
            fVar26 = auVar120._8_4_;
            fVar184 = local_2700._8_4_;
            auVar86._8_4_ = fVar184 * fVar26;
            fVar36 = auVar120._12_4_;
            fVar185 = local_2700._12_4_;
            auVar86._12_4_ = fVar185 * fVar36;
            fVar46 = auVar120._16_4_;
            fVar186 = local_2700._16_4_;
            auVar86._16_4_ = fVar186 * fVar46;
            fVar56 = auVar120._20_4_;
            fVar187 = local_2700._20_4_;
            auVar86._20_4_ = fVar187 * fVar56;
            fVar66 = auVar120._24_4_;
            fVar188 = local_2700._24_4_;
            auVar86._24_4_ = fVar188 * fVar66;
            auVar86._28_4_ = auVar141._12_4_;
            fVar136 = auVar128._0_4_;
            fVar159 = auVar127._0_4_;
            fVar17 = auVar128._4_4_;
            fVar162 = auVar127._4_4_;
            auVar88._4_4_ = fVar162 * fVar17;
            auVar88._0_4_ = fVar159 * fVar136;
            fVar27 = auVar128._8_4_;
            fVar163 = auVar127._8_4_;
            auVar88._8_4_ = fVar163 * fVar27;
            fVar37 = auVar128._12_4_;
            fVar164 = auVar127._12_4_;
            auVar88._12_4_ = fVar164 * fVar37;
            fVar47 = auVar128._16_4_;
            fVar165 = auVar127._16_4_;
            auVar88._16_4_ = fVar165 * fVar47;
            fVar57 = auVar128._20_4_;
            fVar166 = auVar127._20_4_;
            auVar88._20_4_ = fVar166 * fVar57;
            fVar67 = auVar128._24_4_;
            uVar87 = auVar146._12_4_;
            fVar167 = auVar127._24_4_;
            auVar88._24_4_ = fVar167 * fVar67;
            auVar88._28_4_ = uVar87;
            local_26c0 = vsubps_avx(auVar88,auVar86);
            fVar137 = auVar144._0_4_;
            fVar18 = auVar144._4_4_;
            auVar90._4_4_ = fVar162 * fVar18;
            auVar90._0_4_ = fVar159 * fVar137;
            fVar28 = auVar144._8_4_;
            auVar90._8_4_ = fVar163 * fVar28;
            fVar38 = auVar144._12_4_;
            auVar90._12_4_ = fVar164 * fVar38;
            fVar48 = auVar144._16_4_;
            auVar90._16_4_ = fVar165 * fVar48;
            fVar58 = auVar144._20_4_;
            auVar90._20_4_ = fVar166 * fVar58;
            fVar68 = auVar144._24_4_;
            uVar89 = local_26c0._28_4_;
            auVar90._24_4_ = fVar167 * fVar68;
            auVar90._28_4_ = uVar89;
            fVar148 = local_27a0._0_4_;
            fVar19 = local_27a0._4_4_;
            auVar91._4_4_ = fVar16 * fVar19;
            auVar91._0_4_ = fVar135 * fVar148;
            fVar29 = local_27a0._8_4_;
            auVar91._8_4_ = fVar26 * fVar29;
            fVar39 = local_27a0._12_4_;
            auVar91._12_4_ = fVar36 * fVar39;
            fVar49 = local_27a0._16_4_;
            auVar91._16_4_ = fVar46 * fVar49;
            fVar59 = local_27a0._20_4_;
            auVar91._20_4_ = fVar56 * fVar59;
            fVar69 = local_27a0._24_4_;
            auVar91._24_4_ = fVar66 * fVar69;
            auVar91._28_4_ = auVar143._12_4_;
            auVar127 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = fVar17 * fVar19;
            auVar92._0_4_ = fVar136 * fVar148;
            auVar92._8_4_ = fVar27 * fVar29;
            auVar92._12_4_ = fVar37 * fVar39;
            auVar92._16_4_ = fVar47 * fVar49;
            auVar92._20_4_ = fVar57 * fVar59;
            auVar92._24_4_ = fVar67 * fVar69;
            auVar92._28_4_ = uVar89;
            auVar93._4_4_ = fVar183 * fVar18;
            auVar93._0_4_ = fVar180 * fVar137;
            auVar93._8_4_ = fVar184 * fVar28;
            auVar93._12_4_ = fVar185 * fVar38;
            auVar93._16_4_ = fVar186 * fVar48;
            auVar93._20_4_ = fVar187 * fVar58;
            auVar93._24_4_ = fVar188 * fVar68;
            auVar93._28_4_ = local_2700._28_4_;
            local_2720 = vsubps_avx(auVar93,auVar92);
            uVar106 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar181._4_4_ = uVar106;
            auVar181._0_4_ = uVar106;
            auVar181._8_4_ = uVar106;
            auVar181._12_4_ = uVar106;
            auVar181._16_4_ = uVar106;
            auVar181._20_4_ = uVar106;
            auVar181._24_4_ = uVar106;
            auVar181._28_4_ = uVar106;
            uVar106 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar189._4_4_ = uVar106;
            auVar189._0_4_ = uVar106;
            auVar189._8_4_ = uVar106;
            auVar189._12_4_ = uVar106;
            auVar189._16_4_ = uVar106;
            auVar189._20_4_ = uVar106;
            auVar189._24_4_ = uVar106;
            auVar189._28_4_ = uVar106;
            uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar190._4_4_ = uVar1;
            auVar190._0_4_ = uVar1;
            auVar190._8_4_ = uVar1;
            auVar190._12_4_ = uVar1;
            auVar190._16_4_ = uVar1;
            auVar190._20_4_ = uVar1;
            auVar190._24_4_ = uVar1;
            auVar190._28_4_ = uVar1;
            fVar124 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_26e0 = vsubps_avx(auVar147,auVar181);
            fVar133 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar76 = vsubps_avx(auVar152,auVar189);
            auVar77 = vsubps_avx(auVar157,auVar190);
            fVar149 = auVar77._0_4_;
            fVar20 = auVar77._4_4_;
            auVar94._4_4_ = fVar124 * fVar20;
            auVar94._0_4_ = fVar124 * fVar149;
            fVar30 = auVar77._8_4_;
            auVar94._8_4_ = fVar124 * fVar30;
            fVar40 = auVar77._12_4_;
            auVar94._12_4_ = fVar124 * fVar40;
            fVar50 = auVar77._16_4_;
            auVar94._16_4_ = fVar124 * fVar50;
            fVar60 = auVar77._20_4_;
            auVar94._20_4_ = fVar124 * fVar60;
            fVar70 = auVar77._24_4_;
            auVar94._24_4_ = fVar124 * fVar70;
            auVar94._28_4_ = uVar106;
            fVar132 = auVar76._0_4_;
            fVar21 = auVar76._4_4_;
            auVar95._4_4_ = fVar133 * fVar21;
            auVar95._0_4_ = fVar133 * fVar132;
            fVar31 = auVar76._8_4_;
            auVar95._8_4_ = fVar133 * fVar31;
            fVar41 = auVar76._12_4_;
            auVar95._12_4_ = fVar133 * fVar41;
            fVar51 = auVar76._16_4_;
            auVar95._16_4_ = fVar133 * fVar51;
            fVar61 = auVar76._20_4_;
            auVar95._20_4_ = fVar133 * fVar61;
            fVar71 = auVar76._24_4_;
            auVar95._24_4_ = fVar133 * fVar71;
            auVar95._28_4_ = uVar1;
            auVar76 = vsubps_avx(auVar95,auVar94);
            fVar134 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar12 = local_26e0._0_4_;
            fVar22 = local_26e0._4_4_;
            auVar96._4_4_ = fVar133 * fVar22;
            auVar96._0_4_ = fVar133 * fVar12;
            fVar32 = local_26e0._8_4_;
            auVar96._8_4_ = fVar133 * fVar32;
            fVar42 = local_26e0._12_4_;
            auVar96._12_4_ = fVar133 * fVar42;
            fVar52 = local_26e0._16_4_;
            auVar96._16_4_ = fVar133 * fVar52;
            fVar62 = local_26e0._20_4_;
            auVar96._20_4_ = fVar133 * fVar62;
            fVar72 = local_26e0._24_4_;
            auVar96._24_4_ = fVar133 * fVar72;
            auVar96._28_4_ = uVar89;
            auVar97._4_4_ = fVar134 * fVar20;
            auVar97._0_4_ = fVar134 * fVar149;
            auVar97._8_4_ = fVar134 * fVar30;
            auVar97._12_4_ = fVar134 * fVar40;
            auVar97._16_4_ = fVar134 * fVar50;
            auVar97._20_4_ = fVar134 * fVar60;
            auVar97._24_4_ = fVar134 * fVar70;
            auVar97._28_4_ = uVar87;
            auVar77 = vsubps_avx(auVar97,auVar96);
            auVar98._4_4_ = fVar134 * fVar21;
            auVar98._0_4_ = fVar134 * fVar132;
            auVar98._8_4_ = fVar134 * fVar31;
            auVar98._12_4_ = fVar134 * fVar41;
            auVar98._16_4_ = fVar134 * fVar51;
            auVar98._20_4_ = fVar134 * fVar61;
            auVar98._24_4_ = fVar134 * fVar71;
            auVar98._28_4_ = uVar87;
            auVar99._4_4_ = fVar124 * fVar22;
            auVar99._0_4_ = fVar124 * fVar12;
            auVar99._8_4_ = fVar124 * fVar32;
            auVar99._12_4_ = fVar124 * fVar42;
            auVar99._16_4_ = fVar124 * fVar52;
            auVar99._20_4_ = fVar124 * fVar62;
            auVar99._24_4_ = fVar124 * fVar72;
            auVar99._28_4_ = local_26e0._28_4_;
            auVar78 = vsubps_avx(auVar99,auVar98);
            fVar13 = local_2720._0_4_;
            fVar23 = local_2720._4_4_;
            fVar33 = local_2720._8_4_;
            fVar43 = local_2720._12_4_;
            fVar53 = local_2720._16_4_;
            fVar63 = local_2720._20_4_;
            fVar73 = local_2720._24_4_;
            fVar14 = auVar127._0_4_;
            fVar24 = auVar127._4_4_;
            fVar34 = auVar127._8_4_;
            fVar44 = auVar127._12_4_;
            fVar54 = auVar127._16_4_;
            fVar64 = auVar127._20_4_;
            fVar74 = auVar127._24_4_;
            fVar15 = local_26c0._0_4_;
            fVar25 = local_26c0._4_4_;
            fVar35 = local_26c0._8_4_;
            fVar45 = local_26c0._12_4_;
            fVar55 = local_26c0._16_4_;
            fVar65 = local_26c0._20_4_;
            fVar75 = local_26c0._24_4_;
            auVar140._0_4_ = fVar134 * fVar15 + fVar124 * fVar14 + fVar133 * fVar13;
            auVar140._4_4_ = fVar134 * fVar25 + fVar124 * fVar24 + fVar133 * fVar23;
            auVar140._8_4_ = fVar134 * fVar35 + fVar124 * fVar34 + fVar133 * fVar33;
            auVar140._12_4_ = fVar134 * fVar45 + fVar124 * fVar44 + fVar133 * fVar43;
            auVar140._16_4_ = fVar134 * fVar55 + fVar124 * fVar54 + fVar133 * fVar53;
            auVar140._20_4_ = fVar134 * fVar65 + fVar124 * fVar64 + fVar133 * fVar63;
            auVar140._24_4_ = fVar134 * fVar75 + fVar124 * fVar74 + fVar133 * fVar73;
            auVar140._28_4_ = fVar133 + fVar133 + local_26e0._28_4_;
            auVar129._8_4_ = 0x80000000;
            auVar129._0_8_ = 0x8000000080000000;
            auVar129._12_4_ = 0x80000000;
            auVar129._16_4_ = 0x80000000;
            auVar129._20_4_ = 0x80000000;
            auVar129._24_4_ = 0x80000000;
            auVar129._28_4_ = 0x80000000;
            auVar127 = vandps_avx(auVar140,auVar129);
            uVar168 = auVar127._0_4_;
            auVar155._0_4_ =
                 (float)(uVar168 ^
                        (uint)(fVar137 * auVar76._0_4_ +
                              fVar136 * auVar77._0_4_ + fVar135 * auVar78._0_4_));
            uVar104 = auVar127._4_4_;
            auVar155._4_4_ =
                 (float)(uVar104 ^
                        (uint)(fVar18 * auVar76._4_4_ +
                              fVar17 * auVar77._4_4_ + fVar16 * auVar78._4_4_));
            uVar171 = auVar127._8_4_;
            auVar155._8_4_ =
                 (float)(uVar171 ^
                        (uint)(fVar28 * auVar76._8_4_ +
                              fVar27 * auVar77._8_4_ + fVar26 * auVar78._8_4_));
            uVar172 = auVar127._12_4_;
            auVar155._12_4_ =
                 (float)(uVar172 ^
                        (uint)(fVar38 * auVar76._12_4_ +
                              fVar37 * auVar77._12_4_ + fVar36 * auVar78._12_4_));
            uVar173 = auVar127._16_4_;
            auVar155._16_4_ =
                 (float)(uVar173 ^
                        (uint)(fVar48 * auVar76._16_4_ +
                              fVar47 * auVar77._16_4_ + fVar46 * auVar78._16_4_));
            uVar174 = auVar127._20_4_;
            auVar155._20_4_ =
                 (float)(uVar174 ^
                        (uint)(fVar58 * auVar76._20_4_ +
                              fVar57 * auVar77._20_4_ + fVar56 * auVar78._20_4_));
            uVar175 = auVar127._24_4_;
            auVar155._24_4_ =
                 (float)(uVar175 ^
                        (uint)(fVar68 * auVar76._24_4_ +
                              fVar67 * auVar77._24_4_ + fVar66 * auVar78._24_4_));
            uVar176 = auVar127._28_4_;
            auVar155._28_4_ =
                 (float)(uVar176 ^ (uint)(auVar144._28_4_ + auVar128._28_4_ + auVar120._28_4_));
            auVar160._0_4_ =
                 (float)(uVar168 ^
                        (uint)(auVar76._0_4_ * fVar148 +
                              auVar77._0_4_ * fVar180 + fVar159 * auVar78._0_4_));
            auVar160._4_4_ =
                 (float)(uVar104 ^
                        (uint)(auVar76._4_4_ * fVar19 +
                              auVar77._4_4_ * fVar183 + fVar162 * auVar78._4_4_));
            auVar160._8_4_ =
                 (float)(uVar171 ^
                        (uint)(auVar76._8_4_ * fVar29 +
                              auVar77._8_4_ * fVar184 + fVar163 * auVar78._8_4_));
            auVar160._12_4_ =
                 (float)(uVar172 ^
                        (uint)(auVar76._12_4_ * fVar39 +
                              auVar77._12_4_ * fVar185 + fVar164 * auVar78._12_4_));
            auVar160._16_4_ =
                 (float)(uVar173 ^
                        (uint)(auVar76._16_4_ * fVar49 +
                              auVar77._16_4_ * fVar186 + fVar165 * auVar78._16_4_));
            auVar160._20_4_ =
                 (float)(uVar174 ^
                        (uint)(auVar76._20_4_ * fVar59 +
                              auVar77._20_4_ * fVar187 + fVar166 * auVar78._20_4_));
            auVar160._24_4_ =
                 (float)(uVar175 ^
                        (uint)(auVar76._24_4_ * fVar69 +
                              auVar77._24_4_ * fVar188 + fVar167 * auVar78._24_4_));
            auVar160._28_4_ = (float)(uVar176 ^ (uint)(auVar77._28_4_ + auVar78._28_4_ + -0.0));
            auVar144 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar127 = vcmpps_avx(auVar155,auVar144,5);
            auVar144 = vcmpps_avx(auVar160,auVar144,5);
            auVar127 = vandps_avx(auVar127,auVar144);
            auVar130._8_4_ = 0x7fffffff;
            auVar130._0_8_ = 0x7fffffff7fffffff;
            auVar130._12_4_ = 0x7fffffff;
            auVar130._16_4_ = 0x7fffffff;
            auVar130._20_4_ = 0x7fffffff;
            auVar130._24_4_ = 0x7fffffff;
            auVar130._28_4_ = 0x7fffffff;
            local_2600 = vandps_avx(auVar140,auVar130);
            auVar144 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar140,4);
            auVar127 = vandps_avx(auVar127,auVar144);
            auVar131._0_4_ = auVar160._0_4_ + auVar155._0_4_;
            auVar131._4_4_ = auVar160._4_4_ + auVar155._4_4_;
            auVar131._8_4_ = auVar160._8_4_ + auVar155._8_4_;
            auVar131._12_4_ = auVar160._12_4_ + auVar155._12_4_;
            auVar131._16_4_ = auVar160._16_4_ + auVar155._16_4_;
            auVar131._20_4_ = auVar160._20_4_ + auVar155._20_4_;
            auVar131._24_4_ = auVar160._24_4_ + auVar155._24_4_;
            auVar131._28_4_ = auVar160._28_4_ + auVar155._28_4_;
            auVar128 = vcmpps_avx(auVar131,local_2600,2);
            auVar144 = vandps_avx(auVar127,auVar128);
            auVar120 = local_26a0 & auVar144;
            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0x7f,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0xbf,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar120[0x1f] < '\0') {
              auVar144 = vandps_avx(auVar144,local_26a0);
              local_2620._0_4_ =
                   (float)(uVar168 ^ (uint)(fVar15 * fVar12 + fVar14 * fVar132 + fVar149 * fVar13));
              local_2620._4_4_ =
                   (float)(uVar104 ^ (uint)(fVar25 * fVar22 + fVar24 * fVar21 + fVar20 * fVar23));
              local_2620._8_4_ =
                   (float)(uVar171 ^ (uint)(fVar35 * fVar32 + fVar34 * fVar31 + fVar30 * fVar33));
              local_2620._12_4_ =
                   (float)(uVar172 ^ (uint)(fVar45 * fVar42 + fVar44 * fVar41 + fVar40 * fVar43));
              local_2620._16_4_ =
                   (float)(uVar173 ^ (uint)(fVar55 * fVar52 + fVar54 * fVar51 + fVar50 * fVar53));
              local_2620._20_4_ =
                   (float)(uVar174 ^ (uint)(fVar65 * fVar62 + fVar64 * fVar61 + fVar60 * fVar63));
              local_2620._24_4_ =
                   (float)(uVar175 ^ (uint)(fVar75 * fVar72 + fVar74 * fVar71 + fVar70 * fVar73));
              local_2620._28_4_ =
                   uVar176 ^ (uint)(auVar128._28_4_ + auVar128._28_4_ + auVar127._28_4_);
              fVar124 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar133 = local_2600._0_4_;
              fVar134 = local_2600._4_4_;
              auVar100._4_4_ = fVar134 * fVar124;
              auVar100._0_4_ = fVar133 * fVar124;
              fVar135 = local_2600._8_4_;
              auVar100._8_4_ = fVar135 * fVar124;
              fVar136 = local_2600._12_4_;
              auVar100._12_4_ = fVar136 * fVar124;
              fVar137 = local_2600._16_4_;
              auVar100._16_4_ = fVar137 * fVar124;
              fVar148 = local_2600._20_4_;
              auVar100._20_4_ = fVar148 * fVar124;
              fVar149 = local_2600._24_4_;
              auVar100._24_4_ = fVar149 * fVar124;
              auVar100._28_4_ = fVar124;
              auVar127 = vcmpps_avx(auVar100,local_2620,1);
              fVar124 = (ray->super_RayK<1>).tfar;
              auVar101._4_4_ = fVar134 * fVar124;
              auVar101._0_4_ = fVar133 * fVar124;
              auVar101._8_4_ = fVar135 * fVar124;
              auVar101._12_4_ = fVar136 * fVar124;
              auVar101._16_4_ = fVar137 * fVar124;
              auVar101._20_4_ = fVar148 * fVar124;
              auVar101._24_4_ = fVar149 * fVar124;
              auVar101._28_4_ = fVar124;
              auVar128 = vcmpps_avx(local_2620,auVar101,2);
              auVar127 = vandps_avx(auVar128,auVar127);
              auVar128 = auVar144 & auVar127;
              if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar128 >> 0x7f,0) != '\0') ||
                    (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar128 >> 0xbf,0) != '\0') ||
                  (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar128[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar144,auVar127);
                local_25c0 = auVar127;
                auVar144 = vsubps_avx(local_2600,auVar160);
                local_2660 = vblendvps_avx(auVar155,auVar144,local_24c0);
                auVar144 = vsubps_avx(local_2600,auVar155);
                local_2640 = vblendvps_avx(auVar160,auVar144,local_24c0);
                local_2540[0] = fVar15 * (float)local_24e0._0_4_;
                local_2540[1] = fVar25 * (float)local_24e0._4_4_;
                local_2540[2] = fVar35 * fStack_24d8;
                local_2540[3] = fVar45 * fStack_24d4;
                fStack_2530 = fVar55 * fStack_24d0;
                fStack_252c = fVar65 * fStack_24cc;
                fStack_2528 = fVar75 * fStack_24c8;
                fStack_2524 = auVar160._28_4_;
                local_2520[0] = fVar14 * (float)local_24e0._0_4_;
                local_2520[1] = fVar24 * (float)local_24e0._4_4_;
                local_2520[2] = fVar34 * fStack_24d8;
                local_2520[3] = fVar44 * fStack_24d4;
                fStack_2510 = fVar54 * fStack_24d0;
                fStack_250c = fVar64 * fStack_24cc;
                fStack_2508 = fVar74 * fStack_24c8;
                fStack_2504 = auVar160._28_4_;
                auVar144 = vrcpps_avx(local_2600);
                local_2500[0] = (float)local_24e0._0_4_ * fVar13;
                local_2500[1] = (float)local_24e0._4_4_ * fVar23;
                local_2500[2] = fStack_24d8 * fVar33;
                local_2500[3] = fStack_24d4 * fVar43;
                fStack_24f0 = fStack_24d0 * fVar53;
                fStack_24ec = fStack_24cc * fVar63;
                fStack_24e8 = fStack_24c8 * fVar73;
                uStack_24e4 = uStack_24c4;
                fVar124 = auVar144._0_4_;
                fVar132 = auVar144._4_4_;
                auVar102._4_4_ = fVar134 * fVar132;
                auVar102._0_4_ = fVar133 * fVar124;
                fVar133 = auVar144._8_4_;
                auVar102._8_4_ = fVar135 * fVar133;
                fVar134 = auVar144._12_4_;
                auVar102._12_4_ = fVar136 * fVar134;
                fVar135 = auVar144._16_4_;
                auVar102._16_4_ = fVar137 * fVar135;
                fVar136 = auVar144._20_4_;
                auVar102._20_4_ = fVar148 * fVar136;
                fVar137 = auVar144._24_4_;
                auVar102._24_4_ = fVar149 * fVar137;
                auVar102._28_4_ = local_2600._28_4_;
                auVar153._8_4_ = 0x3f800000;
                auVar153._0_8_ = &DAT_3f8000003f800000;
                auVar153._12_4_ = 0x3f800000;
                auVar153._16_4_ = 0x3f800000;
                auVar153._20_4_ = 0x3f800000;
                auVar153._24_4_ = 0x3f800000;
                auVar153._28_4_ = 0x3f800000;
                auVar144 = vsubps_avx(auVar153,auVar102);
                fVar124 = fVar124 + fVar124 * auVar144._0_4_;
                fVar132 = fVar132 + fVar132 * auVar144._4_4_;
                fVar133 = fVar133 + fVar133 * auVar144._8_4_;
                fVar134 = fVar134 + fVar134 * auVar144._12_4_;
                fVar135 = fVar135 + fVar135 * auVar144._16_4_;
                fVar136 = fVar136 + fVar136 * auVar144._20_4_;
                fVar137 = fVar137 + fVar137 * auVar144._24_4_;
                local_27a0._4_4_ = fVar132 * local_2620._4_4_;
                local_27a0._0_4_ = fVar124 * local_2620._0_4_;
                local_27a0._8_4_ = fVar133 * local_2620._8_4_;
                local_27a0._12_4_ = fVar134 * local_2620._12_4_;
                local_27a0._16_4_ = fVar135 * local_2620._16_4_;
                local_27a0._20_4_ = fVar136 * local_2620._20_4_;
                local_27a0._24_4_ = fVar137 * local_2620._24_4_;
                local_27a0._28_4_ = auVar144._28_4_;
                local_2740 = auVar127;
                local_2560 = local_27a0;
                local_25a0[0] = local_2660._0_4_ * fVar124;
                local_25a0[1] = local_2660._4_4_ * fVar132;
                local_25a0[2] = local_2660._8_4_ * fVar133;
                local_25a0[3] = local_2660._12_4_ * fVar134;
                fStack_2590 = local_2660._16_4_ * fVar135;
                fStack_258c = local_2660._20_4_ * fVar136;
                fStack_2588 = local_2660._24_4_ * fVar137;
                uStack_2584 = local_2660._28_4_;
                local_2580[0] = local_2640._0_4_ * fVar124;
                local_2580[1] = local_2640._4_4_ * fVar132;
                local_2580[2] = local_2640._8_4_ * fVar133;
                local_2580[3] = local_2640._12_4_ * fVar134;
                fStack_2570 = local_2640._16_4_ * fVar135;
                fStack_256c = local_2640._20_4_ * fVar136;
                fStack_2568 = local_2640._24_4_ * fVar137;
                uStack_2564 = local_2640._28_4_;
                auVar121._8_4_ = 0x7f800000;
                auVar121._0_8_ = 0x7f8000007f800000;
                auVar121._12_4_ = 0x7f800000;
                auVar121._16_4_ = 0x7f800000;
                auVar121._20_4_ = 0x7f800000;
                auVar121._24_4_ = 0x7f800000;
                auVar121._28_4_ = 0x7f800000;
                auVar144 = vblendvps_avx(auVar121,local_27a0,auVar127);
                auVar128 = vshufps_avx(auVar144,auVar144,0xb1);
                auVar128 = vminps_avx(auVar144,auVar128);
                auVar120 = vshufpd_avx(auVar128,auVar128,5);
                auVar128 = vminps_avx(auVar128,auVar120);
                auVar120 = vperm2f128_avx(auVar128,auVar128,1);
                auVar128 = vminps_avx(auVar128,auVar120);
                auVar144 = vcmpps_avx(auVar144,auVar128,0);
                auVar128 = auVar127 & auVar144;
                if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar128 >> 0x7f,0) != '\0') ||
                      (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar128 >> 0xbf,0) != '\0') ||
                    (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar128[0x1f] < '\0') {
                  auVar127 = vandps_avx(auVar144,auVar127);
                }
                uVar104 = vmovmskps_avx(auVar127);
                uVar168 = 0;
                if (uVar104 != 0) {
                  for (; (uVar104 >> uVar168 & 1) == 0; uVar168 = uVar168 + 1) {
                  }
                }
                do {
                  uVar118 = CONCAT44(0,uVar168);
                  uVar168 = *(uint *)((long)&local_23c0 + uVar118 * 4);
                  pGVar10 = (pSVar4->geometries).items[uVar168].ptr;
                  if ((pGVar10->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2740 + uVar118 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar124 = local_25a0[uVar118];
                      fVar133 = local_2580[uVar118];
                      (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar118 * 4);
                      (ray->Ng).field_0.field_0.x = local_2540[uVar118];
                      (ray->Ng).field_0.field_0.y = local_2520[uVar118];
                      (ray->Ng).field_0.field_0.z = local_2500[uVar118];
                      ray->u = fVar124;
                      ray->v = fVar133;
                      ray->primID = *(uint *)((long)&local_2680 + uVar118 * 4);
                      ray->geomID = uVar168;
                      pRVar11 = context->user;
                      ray->instID[0] = pRVar11->instID[0];
                      ray->instPrimID[0] = pRVar11->instPrimID[0];
                      break;
                    }
                    local_2700._0_8_ = context->args;
                    local_27d0.context = context->user;
                    local_2770 = local_2540[uVar118];
                    local_276c = local_2520[uVar118];
                    local_2768 = local_2500[uVar118];
                    local_2764 = local_25a0[uVar118];
                    local_2760 = local_2580[uVar118];
                    local_275c = *(undefined4 *)((long)&local_2680 + uVar118 * 4);
                    local_2758 = uVar168;
                    local_2754 = (local_27d0.context)->instID[0];
                    local_2750 = (local_27d0.context)->instPrimID[0];
                    local_2720._0_4_ = (ray->super_RayK<1>).tfar;
                    local_26c0._0_8_ = uVar118;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + uVar118 * 4);
                    local_27d4 = -1;
                    local_27d0.valid = &local_27d4;
                    local_27d0.geometryUserPtr = pGVar10->userPtr;
                    local_27d0.ray = (RTCRayN *)ray;
                    local_27d0.hit = (RTCHitN *)&local_2770;
                    local_27d0.N = 1;
                    local_26e0._0_8_ = pGVar10;
                    if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar10->intersectionFilterN)(&local_27d0), *local_27d0.valid != 0)) {
                      if (*(code **)(local_2700._0_8_ + 0x10) != (code *)0x0) {
                        if (((*(byte *)local_2700._0_8_ & 2) != 0) ||
                           ((*(byte *)(local_26e0._0_8_ + 0x3e) & 0x40) != 0)) {
                          (**(code **)(local_2700._0_8_ + 0x10))(&local_27d0);
                        }
                        if (*local_27d0.valid == 0) goto LAB_015b7c4e;
                      }
                      (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_27d0.hit;
                      (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_27d0.hit + 4);
                      (((Vec3f *)((long)local_27d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_27d0.hit + 8);
                      *(float *)((long)local_27d0.ray + 0x3c) = *(float *)(local_27d0.hit + 0xc);
                      *(float *)((long)local_27d0.ray + 0x40) = *(float *)(local_27d0.hit + 0x10);
                      *(float *)((long)local_27d0.ray + 0x44) = *(float *)(local_27d0.hit + 0x14);
                      *(float *)((long)local_27d0.ray + 0x48) = *(float *)(local_27d0.hit + 0x18);
                      *(float *)((long)local_27d0.ray + 0x4c) = *(float *)(local_27d0.hit + 0x1c);
                      *(float *)((long)local_27d0.ray + 0x50) = *(float *)(local_27d0.hit + 0x20);
                    }
                    else {
LAB_015b7c4e:
                      (ray->super_RayK<1>).tfar = (float)local_2720._0_4_;
                    }
                    *(undefined4 *)(local_2740 + local_26c0._0_8_ * 4) = 0;
                    fVar124 = (ray->super_RayK<1>).tfar;
                    auVar122._4_4_ = fVar124;
                    auVar122._0_4_ = fVar124;
                    auVar122._8_4_ = fVar124;
                    auVar122._12_4_ = fVar124;
                    auVar122._16_4_ = fVar124;
                    auVar122._20_4_ = fVar124;
                    auVar122._24_4_ = fVar124;
                    auVar122._28_4_ = fVar124;
                    auVar127 = vcmpps_avx(local_27a0,auVar122,2);
                    local_2740 = vandps_avx(auVar127,local_2740);
                  }
                  if ((((((((local_2740 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_2740 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_2740 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_2740 >> 0x7f,0) == '\0') &&
                        (local_2740 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_2740 >> 0xbf,0) == '\0') &&
                      (local_2740 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_2740[0x1f]) break;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,true>>>
                  ::intersect(&local_27d0);
                  uVar168 = (uint)local_27d0.valid;
                } while( true );
              }
            }
            lVar117 = lVar117 + 1;
          } while (lVar117 != uVar112 - 8);
        }
        fVar124 = (ray->super_RayK<1>).tfar;
        auVar123 = ZEXT3264(CONCAT428(fVar124,CONCAT424(fVar124,CONCAT420(fVar124,CONCAT416(fVar124,
                                                  CONCAT412(fVar124,CONCAT48(fVar124,CONCAT44(
                                                  fVar124,fVar124))))))));
        auVar156 = ZEXT3264(local_23e0);
        auVar158 = ZEXT3264(local_2400);
        auVar161 = ZEXT3264(local_2420);
        auVar170 = ZEXT3264(local_2440);
        auVar178 = ZEXT3264(local_2460);
        auVar179 = ZEXT3264(local_2480);
        auVar182 = ZEXT3264(local_24a0);
        uVar112 = local_2780;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }